

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetB_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x42;
  uint64_t x41;
  uint64_t x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  uint64_t x36;
  uint64_t x35;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x34;
  uint64_t x33;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x32;
  uint64_t x31;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x30;
  uint64_t x29;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x28;
  uint64_t x27;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x26;
  uint64_t x25;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x24;
  uint64_t x23;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x22;
  uint64_t x21;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x20;
  uint64_t x19;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x18;
  uint64_t x17;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x16;
  uint64_t x15;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x14;
  uint64_t x13;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x12;
  uint64_t x11;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x10;
  uint64_t x9;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x8;
  uint64_t x7;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x6;
  uint64_t x5;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x4;
  uint64_t x3;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x2;
  uint64_t x1;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  uint64_t in_stack_fffffffffffffeb8;
  uint64_t in_stack_fffffffffffffec0;
  undefined7 local_138;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 in_stack_fffffffffffffecf;
  uint64_t *in_stack_fffffffffffffed0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_121;
  uint64_t local_120;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_111;
  uint64_t local_110;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_101;
  uint64_t local_100;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_f1;
  uint64_t local_f0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_e1;
  uint64_t local_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_d1;
  uint64_t local_d0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_c1;
  uint64_t local_c0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_b1;
  uint64_t local_b0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_a1;
  uint64_t local_a0;
  byte local_91;
  uint64_t local_90;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_81;
  uint64_t local_80;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_71;
  uint64_t local_70;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_61;
  uint64_t local_60;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_51;
  uint64_t local_50;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_41;
  uint64_t local_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_31;
  uint64_t local_30;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_21;
  uint64_t local_20;
  uint64_t *local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&local_20,&local_21,'\0',*in_RSI,*in_RDX);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_30,&local_31,local_21,local_10[1],local_18[1]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_40,&local_41,local_31,local_10[2],local_18[2]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_50,&local_51,local_41,local_10[3],local_18[3]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_60,&local_61,local_51,local_10[4],local_18[4]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_70,&local_71,local_61,local_10[5],local_18[5]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_80,&local_81,local_71,local_10[6],local_18[6]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_90,&local_91,local_81,local_10[7],local_18[7]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_a0,&local_a1,'\0',local_20,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_b0,&local_b1,local_a1,local_30,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_c0,&local_c1,local_b1,local_40,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_d0,&local_d1,local_c1,local_50,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_e0,&local_e1,local_d1,local_60,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_f0,&local_f1,local_e1,local_70,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_100,&local_101,local_f1,local_80,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_110,&local_111,local_101,local_90,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_120,&local_121,local_111,(ulong)local_91,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecf,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  *local_8 = in_stack_fffffffffffffed0;
  local_8[1] = CONCAT17(in_stack_fffffffffffffecf,local_138);
  local_8[2] = in_stack_fffffffffffffec0;
  local_8[3] = in_stack_fffffffffffffeb8;
  local_8[4] = local_150;
  local_8[5] = local_158;
  local_8[6] = local_160;
  local_8[7] = local_168;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_add(
    uint64_t out1[8], const uint64_t arg1[8], const uint64_t arg2[8]) {
    uint64_t x1;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x2;
    uint64_t x3;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x4;
    uint64_t x5;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x6;
    uint64_t x7;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x8;
    uint64_t x9;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x10;
    uint64_t x11;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x12;
    uint64_t x13;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x14;
    uint64_t x15;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x16;
    uint64_t x17;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x18;
    uint64_t x19;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x20;
    uint64_t x21;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x22;
    uint64_t x23;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x24;
    uint64_t x25;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x26;
    uint64_t x27;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x28;
    uint64_t x29;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x30;
    uint64_t x31;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x32;
    uint64_t x33;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x1, &x2, 0x0, (arg1[0]), (arg2[0]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x3, &x4, x2, (arg1[1]), (arg2[1]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x5, &x6, x4, (arg1[2]), (arg2[2]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x7, &x8, x6, (arg1[3]), (arg2[3]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x9, &x10, x8, (arg1[4]), (arg2[4]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x11, &x12, x10, (arg1[5]), (arg2[5]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x13, &x14, x12, (arg1[6]), (arg2[6]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x15, &x16, x14, (arg1[7]), (arg2[7]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x17, &x18, 0x0,
                                                             x1, UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x19, &x20, x18,
                                                             x3, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x21, &x22, x20,
                                                             x5, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x23, &x24, x22,
                                                             x7, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x25, &x26, x24,
                                                             x9, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x27, &x28, x26,
                                                             x11, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x29, &x30, x28,
                                                             x13, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x31, &x32, x30, x15, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x33, &x34, x32,
                                                             x16, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x35, x34, x17, x1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x36, x34, x19, x3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x37, x34, x21, x5);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x38, x34, x23, x7);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x39, x34, x25, x9);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x40, x34, x27, x11);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x41, x34, x29, x13);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x42, x34, x31, x15);
    out1[0] = x35;
    out1[1] = x36;
    out1[2] = x37;
    out1[3] = x38;
    out1[4] = x39;
    out1[5] = x40;
    out1[6] = x41;
    out1[7] = x42;
}